

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O3

bool __thiscall pbrt::Transform::HasScale(Transform *this,Float tolerance)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Float FVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  fVar1 = (this->m).m[1][1];
  fVar2 = (this->m).m[0][1];
  fVar3 = (this->m).m[1][0];
  fVar4 = (this->m).m[0][0];
  fVar5 = (this->m).m[1][2];
  auVar16 = ZEXT816(0) << 0x40;
  fVar6 = (this->m).m[2][1];
  fVar7 = (this->m).m[0][2];
  FVar8 = (this->m).m[2][0];
  fVar9 = (this->m).m[2][2];
  bVar12 = true;
  fVar10 = fVar1 * 0.0;
  fVar11 = fVar2 * 0.0;
  auVar17 = ZEXT416((uint)(fVar6 * 0.0));
  auVar13 = vaddss_avx512f(ZEXT416((uint)FVar8),auVar17);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 + fVar10)),ZEXT416((uint)fVar5),auVar16);
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar4 + fVar11)),ZEXT416((uint)fVar7),auVar16);
  auVar13 = vfmadd231ss_avx512f(auVar13,ZEXT416((uint)fVar9),auVar16);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * auVar15._0_4_)),auVar14,auVar14);
  auVar14 = vfmadd231ss_avx512f(auVar15,auVar13,auVar13);
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx512vl(ZEXT416((uint)(auVar14._0_4_ + -1.0)),auVar15);
  if (auVar15._0_4_ <= tolerance) {
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)fVar3),auVar16);
    auVar14 = vfmadd231ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar4),auVar16);
    auVar13 = vfmadd231ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)FVar8),auVar16);
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar5),auVar16);
    auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar7),auVar16);
    auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar9),auVar16);
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar15._0_4_ * auVar15._0_4_)),auVar14,auVar14);
    auVar15 = vfmadd231ss_fma(auVar15,auVar13,auVar13);
    auVar14._8_4_ = 0x7fffffff;
    auVar14._0_8_ = 0x7fffffff7fffffff;
    auVar14._12_4_ = 0x7fffffff;
    auVar15 = vandps_avx512vl(ZEXT416((uint)(auVar15._0_4_ + -1.0)),auVar14);
    if (auVar15._0_4_ <= tolerance) {
      auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar3),auVar16,ZEXT416((uint)fVar10));
      auVar14 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar16,ZEXT416((uint)fVar11));
      auVar13 = vfmadd213ss_fma(ZEXT416((uint)FVar8),auVar16,auVar17);
      fVar5 = fVar5 + auVar15._0_4_;
      auVar15 = ZEXT416((uint)(fVar7 + auVar14._0_4_));
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar5)),auVar15,auVar15);
      auVar14 = ZEXT416((uint)(fVar9 + auVar13._0_4_));
      auVar15 = vfmadd231ss_fma(auVar15,auVar14,auVar14);
      auVar13._8_4_ = 0x7fffffff;
      auVar13._0_8_ = 0x7fffffff7fffffff;
      auVar13._12_4_ = 0x7fffffff;
      auVar15 = vandps_avx512vl(ZEXT416((uint)(auVar15._0_4_ + -1.0)),auVar13);
      bVar12 = tolerance < auVar15._0_4_;
    }
  }
  return bVar12;
}

Assistant:

inline Vector3<T> Transform::operator()(const Vector3<T> &v) const {
    T x = v.x, y = v.y, z = v.z;
    return Vector3<T>(m[0][0] * x + m[0][1] * y + m[0][2] * z,
                      m[1][0] * x + m[1][1] * y + m[1][2] * z,
                      m[2][0] * x + m[2][1] * y + m[2][2] * z);
}